

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcGrid,_3UL>::Construct
                   (DB *db,LIST *params)

{
  IfcGrid *in;
  
  in = (IfcGrid *)operator_new(0x178);
  *(undefined ***)&in->field_0x160 = &PTR__Object_007e4a70;
  *(undefined8 *)&in->field_0x168 = 0;
  *(char **)&in->field_0x170 = "IfcGrid";
  Assimp::IFC::Schema_2x3::IfcProduct::IfcProduct
            ((IfcProduct *)in,&PTR_construction_vtable_24__0087ced0);
  *(undefined8 *)&(in->super_IfcProduct).field_0x108 = 0;
  *(undefined ***)&(in->super_IfcProduct).super_IfcObject = &PTR__IfcGrid_0087cdf0;
  *(undefined ***)&in->field_0x160 = &PTR__IfcGrid_0087ceb8;
  *(undefined ***)&(in->super_IfcProduct).super_IfcObject.field_0x88 = &PTR__IfcGrid_0087ce18;
  (in->super_IfcProduct).super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>
  ._vptr_ObjectHelper = (_func_int **)&PTR__IfcGrid_0087ce40;
  *(undefined ***)&(in->super_IfcProduct).super_IfcObject.field_0xd0 = &PTR__IfcGrid_0087ce68;
  *(undefined ***)&(in->super_IfcProduct).field_0x100 = &PTR__IfcGrid_0087ce90;
  *(undefined8 *)&(in->super_IfcProduct).field_0x110 = 0;
  *(undefined8 *)&in->field_0x118 = 0;
  *(undefined8 *)&in->field_0x120 = 0;
  (in->VAxes).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in->VAxes).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in->VAxes).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in->WAxes).ptr.
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in->WAxes).ptr.
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(in->WAxes).ptr.
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(in->WAxes).ptr.
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcGrid>(db,params,in);
  return (Object *)
         (&(in->super_IfcProduct).super_IfcObject.field_0x0 +
         *(long *)(*(long *)&(in->super_IfcProduct).super_IfcObject + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }